

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O1

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc,int bit)

{
  uint_fast32_t *puVar1;
  long lVar2;
  _Bool _Var3;
  jpc_mqstate_t *pjVar4;
  ulong uVar5;
  long lVar6;
  uchar *puVar7;
  uint_fast32_t uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  jas_stream_t *pjVar12;
  uint uVar13;
  sbyte sVar14;
  uint_fast32_t uVar15;
  
  iVar10 = jas_getdbglevel();
  if (99 < iVar10) {
    jas_eprintf("jpc_mqenc_putbit(%p, %d)\n",mqenc,bit);
  }
  pjVar4 = *mqenc->curctx;
  _Var3 = pjVar4->mps;
  uVar5 = pjVar4->qeval;
  uVar11 = mqenc->areg - uVar5;
  mqenc->areg = uVar11;
  if ((uint)_Var3 == bit) {
    if ((short)uVar11 < 0) {
      mqenc->creg = mqenc->creg + uVar5;
    }
    else {
      jpc_mqenc_codemps2(mqenc);
    }
  }
  else {
    if (uVar11 < uVar5) {
      mqenc->creg = mqenc->creg + uVar5;
    }
    else {
      mqenc->areg = uVar5;
    }
    *mqenc->curctx = pjVar4->nlps;
    do {
      mqenc->areg = mqenc->areg << 1;
      uVar15 = mqenc->creg;
      uVar8 = uVar15 * 2;
      mqenc->creg = uVar8;
      puVar1 = &mqenc->ctreg;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        lVar6 = mqenc->outbuf;
        if (lVar6 == 0xff) {
LAB_001231d5:
          pjVar12 = mqenc->out;
          if ((pjVar12->flags_ & 7U) == 0) {
            if ((-1 < pjVar12->rwlimit_) && (pjVar12->rwlimit_ <= pjVar12->rwcnt_)) {
              pjVar12->flags_ = pjVar12->flags_ | 4;
              goto LAB_001231e4;
            }
            *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
            iVar10 = pjVar12->cnt_;
            pjVar12->cnt_ = iVar10 + -1;
            if (iVar10 < 1) {
              iVar10 = jas_stream_flushbuf(pjVar12,0xff);
              if (iVar10 == -1) goto LAB_001231e4;
            }
            else {
              pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
              puVar7 = pjVar12->ptr_;
              pjVar12->ptr_ = puVar7 + 1;
              *puVar7 = 0xff;
            }
          }
          else {
LAB_001231e4:
            *(byte *)&mqenc->err = (byte)mqenc->err | 1;
          }
          uVar15 = 7;
          uVar13 = 0xfffff;
          sVar14 = 0x14;
        }
        else {
          if (((uint)uVar15 >> 0x1a & 1) == 0) {
            uVar15 = 8;
            uVar13 = 0x7ffff;
            sVar14 = 0x13;
            if (lVar6 < 0) goto LAB_0012336e;
            pjVar12 = mqenc->out;
            if ((pjVar12->flags_ & 7U) == 0) {
              if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
                *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
                iVar10 = pjVar12->cnt_;
                pjVar12->cnt_ = iVar10 + -1;
                if (iVar10 < 1) {
                  uVar9 = (uint)lVar6;
LAB_00123360:
                  uVar15 = 8;
                  sVar14 = 0x13;
                  uVar13 = 0x7ffff;
                  iVar10 = jas_stream_flushbuf(pjVar12,uVar9 & 0xff);
                  if (iVar10 == -1) goto LAB_0012336a;
                }
                else {
                  pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
                  puVar7 = pjVar12->ptr_;
                  pjVar12->ptr_ = puVar7 + 1;
                  *puVar7 = (uchar)lVar6;
                }
                goto LAB_0012336e;
              }
              pjVar12->flags_ = pjVar12->flags_ | 4;
            }
            goto LAB_0012336a;
          }
          lVar2 = lVar6 + 1;
          mqenc->outbuf = lVar2;
          if (lVar2 == 0xff) {
            mqenc->creg = (ulong)((uint)uVar8 & 0x7fffffe);
            goto LAB_001231d5;
          }
          uVar15 = 8;
          uVar13 = 0x7ffff;
          sVar14 = 0x13;
          if (-2 < lVar6) {
            pjVar12 = mqenc->out;
            if ((pjVar12->flags_ & 7U) == 0) {
              if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
                *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
                iVar10 = pjVar12->cnt_;
                pjVar12->cnt_ = iVar10 + -1;
                if (iVar10 < 1) {
                  uVar9 = (uint)lVar2;
                  goto LAB_00123360;
                }
                pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
                puVar7 = pjVar12->ptr_;
                pjVar12->ptr_ = puVar7 + 1;
                *puVar7 = (uchar)lVar2;
                goto LAB_0012336e;
              }
              pjVar12->flags_ = pjVar12->flags_ | 4;
            }
LAB_0012336a:
            uVar15 = 8;
            sVar14 = 0x13;
            uVar13 = 0x7ffff;
            *(byte *)&mqenc->err = (byte)mqenc->err | 1;
          }
        }
LAB_0012336e:
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> sVar14 & 0xff;
        mqenc->creg = (ulong)((uint)mqenc->creg & uVar13);
        mqenc->ctreg = uVar15;
      }
    } while ((mqenc->areg & 0x8000) == 0);
  }
  return -(uint)(mqenc->err != 0);
}

Assistant:

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc, int bit)
{
	const jpc_mqstate_t *state;
	JAS_DBGLOG(100, ("jpc_mqenc_putbit(%p, %d)\n", mqenc, bit));
	JPC_MQENC_CALL(100, jpc_mqenc_dump(mqenc, stderr));

	state = *(mqenc->curctx);

	if (state->mps == bit) {
		/* Apply the CODEMPS algorithm as defined in the standard. */
		mqenc->areg -= state->qeval;
		if (!(mqenc->areg & 0x8000)) {
			jpc_mqenc_codemps2(mqenc);
		} else {
			mqenc->creg += state->qeval;
		}
	} else {
		/* Apply the CODELPS algorithm as defined in the standard. */
		jpc_mqenc_codelps2(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc->curctx, mqenc);
	}

	return jpc_mqenc_error(mqenc) ? (-1) : 0;
}